

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDB_DBIStream.cpp
# Opt level: O2

ErrorCode __thiscall PDB::DBIStream::HasValidPublicSymbolStream(DBIStream *this,RawFile *file)

{
  ErrorCode EVar1;
  ErrorCode EVar2;
  HashTableHeader HVar3;
  DirectMSFStream publicStream;
  
  RawFile::CreateMSFStream<PDB::DirectMSFStream>
            (&publicStream,file,(uint)(this->m_header).publicStreamIndex);
  HVar3 = DirectMSFStream::ReadAtOffset<PDB::HashTableHeader>(&publicStream,0x1c);
  EVar2 = UnknownVersion;
  if (HVar3.version == 0xf12f091a) {
    EVar2 = Success;
  }
  EVar1 = InvalidSignature;
  if (HVar3.signature == 0xffffffff) {
    EVar1 = EVar2;
  }
  return EVar1;
}

Assistant:

PDB_NO_DISCARD PDB::ErrorCode PDB::DBIStream::HasValidPublicSymbolStream(const RawFile& file) const PDB_NO_EXCEPT
{
	DirectMSFStream publicStream = file.CreateMSFStream<DirectMSFStream>(m_header.publicStreamIndex);

	// the public symbol stream always begins with a header, we are not interested in that.
	// following the public symbol stream header is a hash table header.
	const HashTableHeader hashHeader = publicStream.ReadAtOffset<HashTableHeader>(sizeof(PublicStreamHeader));
	if (hashHeader.signature != HashTableHeader::Signature)
	{
		return ErrorCode::InvalidSignature;
	}
	else if (hashHeader.version != HashTableHeader::Version)
	{
		return ErrorCode::UnknownVersion;
	}

	return ErrorCode::Success;
}